

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void imm_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  m680x_info *in_RDX;
  MCInst *in_RSI;
  uint8_t imm8;
  uint16_t imm16;
  cs_m680x_op *op;
  cs_m680x *m680x;
  uint8_t local_2b;
  uint16_t local_2a;
  cs_m680x_op *local_28;
  
  bVar1 = in_RSI->Operands[0].field_0x5;
  in_RSI->Operands[0].field_0x5 = bVar1 + 1;
  local_28 = (cs_m680x_op *)((long)in_RSI->Operands + (ulong)bVar1 * 0x18 + 8);
  indexed12_hdlr(in_RSI,in_RDX,(uint16_t *)&in_RSI->Operands[0].Kind);
  local_28->type = M680X_OP_IMMEDIATE;
  if (in_RSI->Operands[0xe].field_2.RegVal == 0xe4) {
    local_2a = 0;
    read_word((m680x_info *)in_RSI,&local_2a,*(uint16_t *)&in_RDX->code);
    *(int *)&local_28->field_1 = (int)(short)local_2a;
    local_28->size = '\x02';
  }
  else {
    local_2b = '\0';
    read_byte((m680x_info *)in_RSI,&local_2b,*(uint16_t *)&in_RDX->code);
    *(int *)&local_28->field_1 = (int)(char)local_2b;
    local_28->size = '\x01';
  }
  set_operand_size((m680x_info *)in_RSI,local_28,'\x01');
  return;
}

Assistant:

static void imm_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	indexed12_hdlr(MI, info, address);
	op->type = M680X_OP_IMMEDIATE;

	if (info->insn == M680X_INS_MOVW) {
		uint16_t imm16 = 0;

		read_word(info, &imm16, *address);
		op->imm = (int16_t)imm16;
		op->size = 2;
	}
	else {
		uint8_t imm8 = 0;

		read_byte(info, &imm8, *address);
		op->imm = (int8_t)imm8;
		op->size = 1;
	}

	set_operand_size(info, op, 1);
}